

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::GoniometricLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::Image,pbrt::RGBColorSpace_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,GoniometricLight *p,Transform *args,
          MediumHandle *args_1,SpectrumHandle *args_2,float *args_3,Image *args_4,
          RGBColorSpace **args_5,polymorphic_allocator<std::byte> *args_6)

{
  MediumInterface *in_RSI;
  undefined8 in_RDI;
  undefined4 *in_R9;
  Image *unaff_retaddr;
  Float in_stack_0000000c;
  SpectrumHandle *in_stack_00000010;
  MediumInterface *in_stack_00000018;
  Transform *in_stack_00000020;
  GoniometricLight *in_stack_00000028;
  Allocator in_stack_00000030;
  SpectrumHandle *in_stack_fffffffffffffe38;
  Image *in_stack_fffffffffffffe40;
  MediumHandle *medium;
  Image *pIVar1;
  undefined4 in_stack_fffffffffffffe70;
  undefined8 local_30;
  
  medium = (MediumHandle *)&stack0xffffffffffffffb8;
  local_30 = in_R9;
  pbrt::MediumHandle::MediumHandle
            ((MediumHandle *)in_stack_fffffffffffffe40,(MediumHandle *)in_stack_fffffffffffffe38);
  pbrt::MediumInterface::MediumInterface(in_RSI,medium);
  pIVar1 = (Image *)&stack0xffffffffffffffb0;
  pbrt::SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  pbrt::Image::Image((Image *)CONCAT44(*(undefined4 *)local_30,in_stack_fffffffffffffe70),pIVar1);
  pbrt::GoniometricLight::GoniometricLight
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
             in_stack_0000000c,unaff_retaddr,(RGBColorSpace *)in_RDI,in_stack_00000030);
  pbrt::Image::~Image(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }